

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdCreateSighash(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                    int hash_type,char *pubkey,char *redeem_script,int64_t value_satoshi,
                    int sighash_type,bool sighash_anyone_can_pay,char **sighash)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  string *psVar4;
  pointer puVar5;
  bool bVar6;
  AddressType AVar7;
  char *pcVar8;
  CfdException *pCVar9;
  WitnessVersion version;
  SigHashType sighashtype;
  Amount value;
  TransactionContext tx;
  allocator local_24f;
  allocator local_24e;
  bool local_24d;
  uint32_t local_24c;
  Pubkey local_248;
  ByteData local_228;
  string local_208;
  OutPoint local_1e0;
  Script local_1b8;
  string local_180;
  void *local_160;
  string local_158;
  SigHashType local_134;
  Amount local_128;
  ConfidentialTransactionContext local_118;
  SigHashType local_60;
  SigHashType local_54;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_24c = vout;
  local_160 = handle;
  cfd::Initialize();
  bVar6 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar6) {
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x90a;
    local_118.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar6 = cfd::capi::IsEmptyString(txid);
  if (bVar6) {
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x910;
    local_118.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x916;
    local_118.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
    cfd::core::logger::log<>((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,"sighash is null.")
    ;
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Failed to parameter. sighash is null.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar7 = cfd::capi::ConvertHashToAddressType(0);
  version = kVersionNone;
  switch(AVar7) {
  case kP2shAddress:
    bVar3 = 1;
    break;
  case kP2pkhAddress:
    bVar3 = 0;
    break;
  case kP2wshAddress:
  case kP2shP2wshAddress:
    bVar2 = 1;
    goto LAB_0043e7e2;
  case kP2wpkhAddress:
  case kP2shP2wpkhAddress:
    bVar2 = 0;
LAB_0043e7e2:
    bVar3 = 0;
    version = kVersion0;
    goto LAB_0043e7ef;
  default:
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x933;
    local_118.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,"hashtype is illegal.");
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Failed to parameter. hashtype is illegal.","");
    cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
    __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = 0;
LAB_0043e7ef:
  local_24d = false;
  cfd::capi::ConvertNetType(net_type,&local_24d);
  cfd::core::Amount::Amount(&local_128,value_satoshi);
  cfd::core::ByteData::ByteData(&local_228);
  cfd::core::SigHashType::Create(&local_134,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  if ((bool)(bVar3 | bVar2)) {
    bVar6 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar6) {
      local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x5f647a;
      local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
           0x942;
      local_118.super_ConfidentialTransaction.vin_.
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,
                 "redeem script is null or empty.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Failed to parameter. redeem script is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
      __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_24d != true) {
      std::__cxx11::string::string((string *)&local_1b8,tx_hex_string,(allocator *)&local_1e0);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (&local_118,(string *)&local_1b8);
      if (local_1b8._vptr_Script !=
          (_func_int **)
          ((long)&local_1b8.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1b8._vptr_Script);
      }
      std::__cxx11::string::string((string *)&local_158,txid,&local_24e);
      cfd::core::Txid::Txid((Txid *)&local_180,&local_158);
      cfd::core::OutPoint::OutPoint(&local_1e0,(Txid *)&local_180,local_24c);
      std::__cxx11::string::string((string *)&local_208,redeem_script,&local_24f);
      cfd::core::Script::Script(&local_1b8,&local_208);
      cfd::core::SigHashType::SigHashType(&local_48,&local_134);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                (&local_248.data_,&local_118,&local_1e0,&local_1b8,&local_48,&local_128,version);
      puVar5 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5);
      }
      if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Script::~Script(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      local_1e0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_1e0.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_180._M_dataplus._M_p = (pointer)&PTR__Txid_00735400;
      if ((void *)local_180._M_string_length != (void *)0x0) {
        operator_delete((void *)local_180._M_string_length);
      }
      psVar4 = &local_158;
LAB_0043ef3d:
      puVar1 = *(undefined1 **)((psVar4->field_2)._M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != &psVar4->field_2) {
        operator_delete(puVar1);
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_118);
      goto LAB_0043ef58;
    }
    std::__cxx11::string::string((string *)&local_1b8,tx_hex_string,(allocator *)&local_1e0);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)&local_118,(string *)&local_1b8);
    if (local_1b8._vptr_Script !=
        (_func_int **)
        ((long)&local_1b8.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_1b8._vptr_Script);
    }
    std::__cxx11::string::string((string *)&local_158,txid,&local_24e);
    cfd::core::Txid::Txid((Txid *)&local_180,&local_158);
    cfd::core::OutPoint::OutPoint(&local_1e0,(Txid *)&local_180,local_24c);
    std::__cxx11::string::string((string *)&local_208,redeem_script,&local_24f);
    cfd::core::Script::Script(&local_1b8,&local_208);
    cfd::core::SigHashType::SigHashType(&local_3c,&local_134);
    cfd::TransactionContext::CreateSignatureHash
              (&local_248.data_,(TransactionContext *)&local_118,&local_1e0,&local_1b8,&local_3c,
               &local_128,version);
    puVar5 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::Script::~Script(&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    local_1e0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_1e0.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_180._M_dataplus._M_p = (pointer)&PTR__Txid_00735400;
    if ((void *)local_180._M_string_length != (void *)0x0) {
      operator_delete((void *)local_180._M_string_length);
    }
    psVar4 = &local_158;
  }
  else {
    bVar6 = cfd::capi::IsEmptyString(pubkey);
    if (bVar6) {
      local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)0x5f647a;
      local_118.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
           0x959;
      local_118.super_ConfidentialTransaction.vin_.
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x5dc638;
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&local_118,kCfdLogLevelWarning,"pubkey is null or empty.");
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)&local_118.super_ConfidentialTransaction.vin_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Failed to parameter. pubkey is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&local_118);
      __cxa_throw(pCVar9,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_24d != true) {
      std::__cxx11::string::string((string *)&local_1b8,tx_hex_string,(allocator *)&local_1e0);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (&local_118,(string *)&local_1b8);
      if (local_1b8._vptr_Script !=
          (_func_int **)
          ((long)&local_1b8.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1b8._vptr_Script);
      }
      std::__cxx11::string::string((string *)&local_180,txid,&local_24e);
      cfd::core::Txid::Txid(&local_1e0.txid_,&local_180);
      cfd::core::OutPoint::OutPoint((OutPoint *)&local_1b8,&local_1e0.txid_,local_24c);
      std::__cxx11::string::string((string *)&local_158,pubkey,&local_24f);
      cfd::core::Pubkey::Pubkey(&local_248,&local_158);
      cfd::core::SigHashType::SigHashType(&local_60,&local_134);
      cfd::ConfidentialTransactionContext::CreateSignatureHash
                ((ByteData *)&local_208,&local_118,(OutPoint *)&local_1b8,&local_248,&local_60,
                 &local_128,version);
      puVar5 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208._M_dataplus._M_p;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_208._M_string_length;
      local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_208.field_2._M_allocated_capacity;
      local_208._M_dataplus._M_p = (pointer)0x0;
      local_208._M_string_length = 0;
      local_208.field_2._M_allocated_capacity = 0;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5);
      }
      if ((pointer)local_208._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      local_1b8._vptr_Script = (_func_int **)&PTR__Txid_00735400;
      if (local_1b8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_1e0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
      if (local_1e0.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      psVar4 = &local_180;
      goto LAB_0043ef3d;
    }
    std::__cxx11::string::string((string *)&local_1b8,tx_hex_string,(allocator *)&local_1e0);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)&local_118,(string *)&local_1b8);
    if (local_1b8._vptr_Script !=
        (_func_int **)
        ((long)&local_1b8.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_1b8._vptr_Script);
    }
    std::__cxx11::string::string((string *)&local_180,txid,&local_24e);
    cfd::core::Txid::Txid(&local_1e0.txid_,&local_180);
    cfd::core::OutPoint::OutPoint((OutPoint *)&local_1b8,&local_1e0.txid_,local_24c);
    std::__cxx11::string::string((string *)&local_158,pubkey,&local_24f);
    cfd::core::Pubkey::Pubkey(&local_248,&local_158);
    cfd::core::SigHashType::SigHashType(&local_54,&local_134);
    cfd::TransactionContext::CreateSignatureHash
              ((ByteData *)&local_208,(TransactionContext *)&local_118,(OutPoint *)&local_1b8,
               &local_248,&local_54,&local_128,version);
    puVar5 = local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208._M_dataplus._M_p;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_208._M_string_length;
    local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_208.field_2._M_allocated_capacity;
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity = 0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    if ((pointer)local_208._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if (local_248.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    local_1b8._vptr_Script = (_func_int **)&PTR__Txid_00735400;
    if (local_1b8.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1e0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_1e0.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    psVar4 = &local_180;
  }
  puVar1 = *(undefined1 **)((psVar4->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar4->field_2) {
    operator_delete(puVar1);
  }
  cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_118);
LAB_0043ef58:
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_118,&local_228);
  pcVar8 = cfd::capi::CreateString((string *)&local_118);
  *sighash = pcVar8;
  if ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
      local_118.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction !=
      &local_118.super_ConfidentialTransaction.vin_) {
    operator_delete(local_118.super_ConfidentialTransaction.super_AbstractTransaction.
                    _vptr_AbstractTransaction);
  }
  if (local_228.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdCreateSighash(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey,
    const char* redeem_script, int64_t value_satoshi, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    WitnessVersion version = WitnessVersion::kVersionNone;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        version = WitnessVersion::kVersion0;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        version = WitnessVersion::kVersion0;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Amount value(value_satoshi);
    ByteData sighash_bytes;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Script(redeem_script),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      if (is_bitcoin) {
        TransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ConfidentialTransactionContext tx(tx_hex_string);
        sighash_bytes = tx.CreateSignatureHash(
            OutPoint(Txid(std::string(txid)), vout), Pubkey(pubkey),
            sighashtype, value, version);
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
    }

    *sighash = CreateString(sighash_bytes.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}